

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O2

int __thiscall QFile::copy(QFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QFilePrivate *this_00;
  long lVar1;
  bool bVar2;
  FileError FVar3;
  int iVar4;
  EVP_PKEY_CTX *src_00;
  long in_FS_OFFSET;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFilePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x1d])
            ((QArrayDataPointer<char16_t> *)&local_50,this);
  lVar1 = CONCAT44(local_50.context.function._4_4_,local_50.context.function._0_4_);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
  if (lVar1 == 0) {
    local_50.context.version = 2;
    local_50.context.function._4_4_ = 0;
    local_50.context._4_8_ = 0;
    local_50.context.file._4_4_ = 0;
    local_50.context.function._0_4_ = 0;
    local_50.context.category = "default";
    iVar4 = 0;
    QMessageLogger::warning(&local_50,"QFile::copy: Empty or null file name");
  }
  else {
    bVar2 = QFileInfo::exists((QString *)dst);
    if (bVar2) {
      tr((QString *)&local_50,"Destination file exists",(char *)0x0,-1);
      QFileDevicePrivate::setError((QFileDevicePrivate *)this_00,CopyError,(QString *)&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
    }
    else {
      QFileDevice::unsetError(&this->super_QFileDevice);
      (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])(this);
      FVar3 = QFileDevice::error(&this->super_QFileDevice);
      if (FVar3 == NoError) {
        iVar4 = QFilePrivate::copy(this_00,dst,src_00);
        goto LAB_0021fd0f;
      }
    }
    iVar4 = 0;
  }
LAB_0021fd0f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::copy(const QString &newName)
{
    Q_D(QFile);
    if (fileName().isEmpty()) {
        qWarning("QFile::copy: Empty or null file name");
        return false;
    }
    if (QFile::exists(newName)) {
        // ### Race condition. If a file is moved in after this, it /will/ be
        // overwritten. On Unix, the proper solution is to use hardlinks:
        // return ::link(old, new) && ::remove(old); See also rename().
        d->setError(QFile::CopyError, tr("Destination file exists"));
        return false;
    }
    unsetError();
    close();
    if (error() == QFile::NoError)
        return d->copy(newName);
    return false;
}